

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr deqp::TestSubcase::Create<glcts::NegativeSSBO>(void)

{
  NegativeSSBO *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (NegativeSSBO *)operator_new(0x38);
  (this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
       = (_func_int **)0x0;
  (this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_gl = (Functions *)0x0;
  (this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
    super_CallLogWrapper.m_enableLog = 0;
  (this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.m_context =
       (Context *)0x0;
  (this->super_BasicUsageCS).counter_buffer_ = 0;
  (this->super_BasicUsageCS).prog_ = 0;
  *(undefined8 *)&(this->super_BasicUsageCS).m_buffer = 0;
  glcts::NegativeSSBO::NegativeSSBO(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}